

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void free_token(JSParseState *s,JSToken *token)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSContext *in_RSI;
  JSValueUnion in_RDI;
  int64_t unaff_retaddr;
  
  switch((in_RSI->header).ref_count) {
  case -0x7f:
  case -0x7e:
    v.tag = unaff_retaddr;
    v.u.ptr = in_RDI.ptr;
    JS_FreeValue(in_RSI,v);
    break;
  case -0x7d:
  case -0x57:
    JS_FreeAtom(in_RSI,0);
    break;
  case -0x7c:
    v_00.tag = unaff_retaddr;
    v_00.u.ptr = in_RDI.ptr;
    JS_FreeValue(in_RSI,v_00);
    v_01.tag = unaff_retaddr;
    v_01.u.ptr = in_RDI.ptr;
    JS_FreeValue(in_RSI,v_01);
    break;
  default:
    if ((-0x56 < (in_RSI->header).ref_count) && ((in_RSI->header).ref_count < -0x27)) {
      JS_FreeAtom(in_RSI,0);
    }
  }
  return;
}

Assistant:

static void free_token(JSParseState *s, JSToken *token)
{
    switch(token->val) {
#ifdef CONFIG_BIGNUM
    case TOK_NUMBER:
        JS_FreeValue(s->ctx, token->u.num.val);
        break;
#endif
    case TOK_STRING:
    case TOK_TEMPLATE:
        JS_FreeValue(s->ctx, token->u.str.str);
        break;
    case TOK_REGEXP:
        JS_FreeValue(s->ctx, token->u.regexp.body);
        JS_FreeValue(s->ctx, token->u.regexp.flags);
        break;
    case TOK_IDENT:
    case TOK_PRIVATE_NAME:
        JS_FreeAtom(s->ctx, token->u.ident.atom);
        break;
    default:
        if (token->val >= TOK_FIRST_KEYWORD &&
            token->val <= TOK_LAST_KEYWORD) {
            JS_FreeAtom(s->ctx, token->u.ident.atom);
        }
        break;
    }
}